

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxForceFeedback.cpp
# Opt level: O1

void __thiscall OIS::LinuxForceFeedback::_stop(LinuxForceFeedback *this,int handle)

{
  ssize_t sVar1;
  undefined8 *puVar2;
  input_event stop;
  undefined1 auStack_18 [16];
  undefined2 local_8;
  undefined2 local_6;
  undefined4 local_4;
  
  local_8 = 0x15;
  local_6 = (undefined2)handle;
  local_4 = 0;
  sVar1 = write(this->mJoyStick,auStack_18,0x18);
  if (sVar1 == 0x18) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x20);
  *puVar2 = &PTR__exception_00123860;
  puVar2[1] = 0x21a00000008;
  puVar2[2] = 
  "/workspace/llm4binary/github/license_c_cmakelists/wgois[P]OIS/src/linux/LinuxForceFeedback.cpp";
  puVar2[3] = "Unknown error stopping effect->..";
  __cxa_throw(puVar2,&Exception::typeinfo,std::exception::~exception);
}

Assistant:

void LinuxForceFeedback::_stop(int handle)
{
	struct input_event stop;

	stop.type  = EV_FF;
	stop.code  = handle;
	stop.value = 0;

#if(OIS_LINUX_JOYFF_DEBUG > 1)
	cout << endl
		 << "LinuxForceFeedback(" << mJoyStick
		 << ") : Stopping effect with handle " << handle << endl;
#endif

	if(write(mJoyStick, &stop, sizeof(stop)) != sizeof(stop))
	{
		OIS_EXCEPT(E_General, "Unknown error stopping effect->..");
	}
}